

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical_cast.h
# Opt level: O2

Time * Fixpp::details::LexicalCast<Fixpp::Type::UTCTimestamp>::cast
                 (Time *__return_storage_ptr__,char *offset,size_t size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  time_t tVar9;
  runtime_error *prVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  tm local_d8;
  undefined1 local_a0 [8];
  RawStreamBuf<char> buf;
  StreamCursor local_40;
  StreamCursor cursor;
  anon_class_8_1_50ba0494 parseFragment;
  
  RawStreamBuf<char>::RawStreamBuf((RawStreamBuf<char> *)local_a0,offset,size);
  local_40.buf = (StreamBuf<char> *)local_a0;
  StreamCursor::advance(&local_40,0);
  cursor.buf = (StreamBuf<char> *)&local_40;
  iVar2 = cast::anon_class_8_1_50ba0494::operator()
                    ((anon_class_8_1_50ba0494 *)&cursor,4,"Could not parse year from UTCTimestamp");
  iVar3 = cast::anon_class_8_1_50ba0494::operator()
                    ((anon_class_8_1_50ba0494 *)&cursor,2,"Could not parse month from UTCTimestamp")
  ;
  iVar4 = cast::anon_class_8_1_50ba0494::operator()
                    ((anon_class_8_1_50ba0494 *)&cursor,2,"Could not parse month from UTCTimestamp")
  ;
  bVar1 = StreamCursor::advance(&local_40,1);
  if (!bVar1) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar10,"Could not parse hour from UTCTimestamp, expected \'-\' got EOF");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar5 = cast::anon_class_8_1_50ba0494::operator()
                    ((anon_class_8_1_50ba0494 *)&cursor,2,"Could not parse hours from UTCTimestamp")
  ;
  bVar1 = StreamCursor::advance(&local_40,1);
  if (bVar1) {
    iVar6 = cast::anon_class_8_1_50ba0494::operator()
                      ((anon_class_8_1_50ba0494 *)&cursor,2,
                       "Could not parse minutes from UTCTimestamp");
    bVar1 = StreamCursor::advance(&local_40,1);
    if (bVar1) {
      iVar7 = cast::anon_class_8_1_50ba0494::operator()
                        ((anon_class_8_1_50ba0494 *)&cursor,2,
                         "Could not parse seconds from UTCTimestamp");
      bVar1 = StreamCursor::eof(&local_40);
      if (bVar1) {
        buf.super_StreamBuf<char>._56_8_ = 0;
        uVar12 = 0;
      }
      else {
        StreamCursor::advance(&local_40,1);
        uVar8 = cast::anon_class_8_1_50ba0494::operator()
                          ((anon_class_8_1_50ba0494 *)&cursor,3,
                           "Could not parse milliseconds from UTCTimestamp");
        uVar12 = 0x100000000;
        buf.super_StreamBuf<char>._56_8_ = ZEXT48(uVar8);
      }
      bVar1 = StreamCursor::eof(&local_40);
      if (bVar1) {
        uVar11 = 0;
        uVar13 = 0;
      }
      else {
        uVar8 = cast::anon_class_8_1_50ba0494::operator()
                          ((anon_class_8_1_50ba0494 *)&cursor,3,
                           "Could not parse microseconds from UTCTimeOnly");
        uVar11 = 0x100000000;
        uVar13 = (ulong)uVar8;
      }
      local_d8.tm_gmtoff = 0;
      local_d8.tm_zone = (char *)0x0;
      local_d8.tm_wday = 0;
      local_d8.tm_yday = 0;
      local_d8.tm_isdst = 0;
      local_d8._36_4_ = 0;
      local_d8.tm_year = iVar2 + -0x76c;
      local_d8.tm_mon = iVar3 + -1;
      local_d8.tm_sec = iVar7;
      local_d8.tm_min = iVar6;
      local_d8.tm_hour = iVar5;
      local_d8.tm_mday = iVar4;
      tVar9 = mkgmtime(&local_d8);
      __return_storage_ptr__->m_time = tVar9;
      (__return_storage_ptr__->m_msec).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int> =
           (_Optional_payload_base<int>)(uVar12 | buf.super_StreamBuf<char>._56_8_);
      (__return_storage_ptr__->m_usec).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int> = (_Optional_payload_base<int>)(uVar13 | uVar11);
      std::streambuf::~streambuf((streambuf *)local_a0);
      return __return_storage_ptr__;
    }
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar10,"Could not parse seconds from UTCTimestamp, expected \':\' got EOF");
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (prVar10,"Could not parse minutes from UTCTimestamp, expected \':\' got EOF");
  __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static Type::UTCTimestamp::Time cast(const char* offset, size_t size)
            {
                RawStreamBuf<> buf(const_cast<char *>(offset), size);
                StreamCursor cursor(&buf);

                const auto parseFragment = [&](size_t size, const char* error)
                {
                    int value;
                    if (!match_int_fast_n(&value, cursor, size))
                        throw std::runtime_error(error);
                    return value;
                };

                const int year  = parseFragment(4, "Could not parse year from UTCTimestamp");
                const int month = parseFragment(2, "Could not parse month from UTCTimestamp");
                const int day   = parseFragment(2, "Could not parse month from UTCTimestamp");

                // Literal('-')
                if (!cursor.advance(1))
                    throw std::runtime_error("Could not parse hour from UTCTimestamp, expected '-' got EOF");

                const int hour = parseFragment(2, "Could not parse hours from UTCTimestamp");
                //
                // Literal(':')
                if (!cursor.advance(1))
                    throw std::runtime_error("Could not parse minutes from UTCTimestamp, expected ':' got EOF");

                const int min = parseFragment(2, "Could not parse minutes from UTCTimestamp");
                //
                // Literal(':')
                if (!cursor.advance(1))
                    throw std::runtime_error("Could not parse seconds from UTCTimestamp, expected ':' got EOF");

                const int sec = parseFragment(2, "Could not parse seconds from UTCTimestamp");

                std::optional<int> msec;
                if (!cursor.eof())
                {
                    // Literal('.')
                    cursor.advance(1);
                    msec = parseFragment(3, "Could not parse milliseconds from UTCTimestamp");
                }

                std::optional<int> usec;
                if (!cursor.eof())
                {
                    usec = parseFragment(3, "Could not parse microseconds from UTCTimeOnly");
                }

                std::tm tm{};
                // tm_year is year since 1900
                tm.tm_year = year - 1900;
                // tm_mon is 0-indexed
                tm.tm_mon = month - 1;
                tm.tm_mday = day;
                tm.tm_hour = hour;
                tm.tm_min = min;
                tm.tm_sec = sec;

                return {mkgmtime(&tm), msec, usec};
            }